

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

AActor * P_SpawnMapThing(FMapThing *mthing,int position)

{
  AActor **ppAVar1;
  char cVar2;
  short sVar3;
  ushort uVar4;
  BYTE *pBVar5;
  AActor *pAVar6;
  DThinker *pDVar7;
  Node *pNVar8;
  bool bVar9;
  int j;
  uint uVar10;
  uint uVar11;
  Node *pNVar12;
  polyspawns_t *ppVar13;
  PClassActor *type;
  APlayerPawn *pAVar14;
  subsector_t *psVar15;
  AActor *actor;
  int iVar16;
  ulong uVar17;
  PClassActor *pPVar18;
  short *psVar19;
  FDoomEdEntry *pFVar20;
  int i;
  int iVar21;
  long lVar22;
  player_t *this;
  double dVar23;
  FPlayerStart start;
  FPlayerStart local_50;
  
  sVar3 = mthing->EdNum;
  if (sVar3 == 0) {
    return (AActor *)0x0;
  }
  if (sVar3 == -1) {
    return (AActor *)0x0;
  }
  pFVar20 = mthing->info;
  if (pFVar20 == (FDoomEdEntry *)0x0) {
    Printf("Unknown type %i at (%.1f, %.1f)\n",SUB84((mthing->pos).X,0),(mthing->pos).Y,
           (ulong)(uint)(int)sVar3);
    pNVar8 = DoomEdMap.Nodes;
    do {
      pNVar12 = pNVar8;
      if ((pNVar12 == (Node *)0x0) || (pNVar12->Next == (Node *)0x1)) {
        pNVar12 = (Node *)0x0;
        break;
      }
      pNVar8 = pNVar12->Next;
    } while ((pNVar12->Pair).Key != 0);
    pFVar20 = &(pNVar12->Pair).Value;
    if (pNVar12 == (Node *)0x0) {
      return (AActor *)0x0;
    }
  }
  if ((pFVar20->Type == (PClassActor *)0x0) && (pFVar20->Special < 1)) {
    return (AActor *)0x0;
  }
  cVar2 = pFVar20->ArgsDefined;
  if (0 < (long)cVar2) {
    if (pFVar20->Type != (PClassActor *)0x0) {
      mthing->special = (int)pFVar20->Special;
    }
    memcpy(mthing->args,pFVar20->Args,(long)cVar2 << 2);
  }
  iVar21 = -1;
  if (pFVar20->Type == (PClassActor *)0x0) {
    uVar4 = pFVar20->Special;
    if (uVar4 - 1 < 8) {
      iVar21 = (short)uVar4 + -1;
    }
    else {
      if (uVar4 - 0xb < 4) {
        ppVar13 = (polyspawns_t *)operator_new(0x20);
        ppVar13->next = polyspawns;
        dVar23 = (mthing->pos).Y;
        (ppVar13->pos).X = (mthing->pos).X;
        (ppVar13->pos).Y = dVar23;
        ppVar13->angle = mthing->angle;
        sVar3 = pFVar20->Special;
        ppVar13->type = sVar3;
        if (sVar3 == 0xb) {
          polyspawns = ppVar13;
          return (AActor *)0x0;
        }
        po_NumPolyobjs = po_NumPolyobjs + 1;
        polyspawns = ppVar13;
        return (AActor *)0x0;
      }
      if (uVar4 == 9) {
        local_50.pos.X = (mthing->pos).X;
        local_50.pos.Y = (mthing->pos).Y;
        local_50.pos.Z = (mthing->pos).Z;
        local_50.type = 0;
        local_50.angle = mthing->angle;
        TArray<FPlayerStart,_FPlayerStart>::Push(&deathmatchstarts,&local_50);
        return (AActor *)0x0;
      }
    }
  }
  if ((iVar21 == -1) || ((level.flags._3_1_ & 2) != 0)) {
    uVar10 = 0x400;
    if (deathmatch.Value == 0) {
      uVar10 = (multiplayer & 1) * 0x100 + 0x100;
    }
    if ((mthing->flags & uVar10) == 0) {
      return (AActor *)0x0;
    }
    uVar10 = G_SkillProperty(SKILLP_SpawnFilter);
    if ((uVar10 & mthing->SkillFilter) == 0) {
      return (AActor *)0x0;
    }
    if (multiplayer == false) {
      uVar10 = player_t::GetSpawnClass((player_t *)(&players + (long)consoleplayer * 0x54));
      if (uVar10 != 0) {
        uVar10 = uVar10 & mthing->ClassFilter;
joined_r0x0052784c:
        if (uVar10 == 0) {
          return (AActor *)0x0;
        }
      }
    }
    else if (deathmatch.Value == 0) {
      lVar22 = 0;
      this = (player_t *)&players;
      uVar10 = 0;
      do {
        if (playeringame[lVar22] == true) {
          uVar11 = player_t::GetSpawnClass(this);
          uVar10 = uVar10 | uVar11 | -(uint)(uVar11 == 0);
        }
        lVar22 = lVar22 + 1;
        this = this + 1;
      } while (lVar22 != 8);
      if (uVar10 != 0xffffffff) {
        uVar10 = uVar10 & mthing->ClassFilter;
        goto joined_r0x0052784c;
      }
    }
  }
  if (iVar21 == -1) {
    if ((pFVar20->Type == (PClassActor *)0x0) && (pFVar20->Special == 10)) {
      uVar10 = 0xffffffff;
      if (mthing->args[0] != 0xff) {
        uVar10 = mthing->args[0];
      }
      if ((int)uVar10 < 0x40) {
        psVar15 = P_PointInSubsector((mthing->pos).X,(mthing->pos).Y);
        psVar15->sector->seqType = (short)uVar10;
        return (AActor *)0x0;
      }
      Printf("Sound sequence %d out of range\n",(ulong)uVar10);
      return (AActor *)0x0;
    }
    type = PClassActor::GetReplacement(pFVar20->Type,true);
    lVar22 = *(long *)((type->super_PClass).Defaults + 0x408);
    if ((lVar22 == 0) || (sprites.Array[*(ushort *)(lVar22 + 0x10)].numframes == '\0')) {
      if (((byte)gameinfo.flags & 2) != 0) {
        return (AActor *)0x0;
      }
      Printf("%s at (%.1f, %.1f) has no frames\n",SUB84((mthing->pos).X,0),(mthing->pos).Y,
             FName::NameData.NameArray
             [(type->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
      type = PClass::FindActor("Unknown");
      bVar9 = DObject::IsKindOf((DObject *)type,PClassActor::RegistrationInfo.MyClass);
      if (!bVar9) {
        __assert_fail("i->IsKindOf(RUNTIME_CLASS(PClassActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_mobj.cpp"
                      ,0x136c,"AActor *P_SpawnMapThing(FMapThing *, int)");
      }
    }
    pBVar5 = (type->super_PClass).Defaults;
    if ((deathmatch.Value != 0) && ((pBVar5[399] & 2) != 0)) {
      return (AActor *)0x0;
    }
    if ((deathmatch.Value == 0) &&
       ((((multiplayer != false && ((dmflags.Value & 0x200000U) != 0)) &&
         ((pBVar5[0x1a4] & 0x10) != 0)) && ((mthing->flags & 0x500) == 0x400)))) {
      return (AActor *)0x0;
    }
    if ((((level.flags2 & 0x8000) != 0) || ((dmflags.Value & 0x1000U) != 0)) &&
       ((pBVar5[0x195] & 0x20) != 0)) {
      return (AActor *)0x0;
    }
    if ((deathmatch.Value != 0) || (alwaysapplydmflags.Value == true)) {
      if ((dmflags.Value & 1U) != 0) {
        pPVar18 = type;
        if (type == (PClassActor *)AHealth::RegistrationInfo.MyClass) {
          return (AActor *)0x0;
        }
        do {
          pPVar18 = (PClassActor *)(pPVar18->super_PClass).ParentClass;
          if (pPVar18 == (PClassActor *)AHealth::RegistrationInfo.MyClass) break;
        } while (pPVar18 != (PClassActor *)0x0);
        if (pPVar18 != (PClassActor *)0x0) {
          return (AActor *)0x0;
        }
        iVar21 = (type->super_PClass).super_PStruct.super_PNamedType.TypeName.Index;
        if (iVar21 == 0x4b) {
          return (AActor *)0x0;
        }
        if (iVar21 == 0x4d) {
          return (AActor *)0x0;
        }
      }
      if (((uint)dmflags.Value >> 9 & 1) != 0) {
        pPVar18 = type;
        if (type == (PClassActor *)AArmor::RegistrationInfo.MyClass) {
          return (AActor *)0x0;
        }
        do {
          pPVar18 = (PClassActor *)(pPVar18->super_PClass).ParentClass;
          if (pPVar18 == (PClassActor *)AArmor::RegistrationInfo.MyClass) break;
        } while (pPVar18 != (PClassActor *)0x0);
        if (pPVar18 != (PClassActor *)0x0) {
          return (AActor *)0x0;
        }
        if ((type->super_PClass).super_PStruct.super_PNamedType.TypeName.Index == 0x4d) {
          return (AActor *)0x0;
        }
      }
    }
    if ((pBVar5[0x18d] & 1) == 0) {
      dVar23 = *(double *)(&DAT_00740700 + (ulong)((pBVar5[400] & 0x40) == 0) * 8);
    }
    else {
      dVar23 = 2147483647.0;
    }
    local_50.pos.X = (mthing->pos).X;
    local_50.pos.Y = (mthing->pos).Y;
    local_50.pos.Z = dVar23;
    actor = AActor::StaticSpawn(type,&local_50.pos,NO_REPLACE,true);
    if ((dVar23 != -2147483648.0) || (NAN(dVar23))) {
      if ((dVar23 == 2147483647.0) && (!NAN(dVar23))) {
        *(double *)&((DThinker *)&(actor->__Pos).Z)->super_DObject =
             *(double *)&((DThinker *)&(actor->__Pos).Z)->super_DObject - (mthing->pos).Z;
      }
    }
    else {
      dVar23 = (mthing->pos).Z;
      *(double *)&((DThinker *)&(actor->__Pos).Z)->super_DObject =
           *(double *)&((DThinker *)&(actor->__Pos).Z)->super_DObject + dVar23;
      if (((*(byte *)&((DThinker *)((long)&(actor->flags2).Value + 2))->super_DObject & 8) != 0) &&
         ((ib_compatflags & 0x100U) != 0)) {
        *(double *)&((DThinker *)&actor->specialf1)->super_DObject = dVar23;
      }
    }
    *(double *)&((DThinker *)&(actor->SpawnPoint).Z)->super_DObject = (mthing->pos).Z;
    *(double *)&((DThinker *)&(actor->SpawnPoint).Y)->super_DObject = (mthing->pos).Y;
    *(double *)&((DThinker *)&actor->SpawnPoint)->super_DObject = (mthing->pos).X;
    *(short *)&((DThinker *)&actor->SpawnAngle)->super_DObject = mthing->angle;
    *(DWORD *)&((DThinker *)&actor->SpawnFlags)->super_DObject = mthing->flags;
    if ((uint)mthing->FloatbobPhase < 0x40) {
      *(BYTE *)&((DThinker *)&actor->FloatBobPhase)->super_DObject = (BYTE)mthing->FloatbobPhase;
    }
    dVar23 = mthing->Gravity;
    if (0.0 <= dVar23) {
      if (dVar23 <= 0.0) {
        pDVar7 = (DThinker *)((long)&(actor->flags).Value + 1);
        *(byte *)&pDVar7->super_DObject = *(byte *)&pDVar7->super_DObject & 0xfd;
      }
      else {
        *(double *)&((DThinker *)&actor->Gravity)->super_DObject =
             dVar23 * *(double *)&((DThinker *)&actor->Gravity)->super_DObject;
      }
    }
    else {
      *(double *)&((DThinker *)&actor->Gravity)->super_DObject = -dVar23;
    }
    dVar23 = *(double *)&((DThinker *)&actor->specialf1)->super_DObject;
    if ((((dVar23 == 0.0) && (!NAN(dVar23))) ||
        ((*(byte *)&((DThinker *)((long)&(actor->flags2).Value + 2))->super_DObject & 8) == 0)) ||
       ((ib_compatflags & 0x100U) == 0)) {
      P_FindFloorCeiling(actor,0xe);
    }
    if ((*(byte *)&((DThinker *)((long)&(actor->flags2).Value + 3))->super_DObject & 0x20) == 0) {
      *(int *)&((DThinker *)&actor->special)->super_DObject = mthing->special;
      lVar22 = 0;
      do {
        actor->args[lVar22] = mthing->args[lVar22];
        lVar22 = lVar22 + 1;
      } while (lVar22 != 5);
    }
    uVar10 = mthing->thingid;
    *(uint *)&((DThinker *)&actor->tid)->super_DObject = uVar10;
    if (uVar10 == 0) {
      *(AActor **)&((DThinker *)&actor->inext)->super_DObject = (AActor *)0x0;
      *(AActor ***)&((DThinker *)&actor->iprev)->super_DObject = (AActor **)0x0;
    }
    else {
      ppAVar1 = AActor::TIDHash + (uVar10 & 0x7f);
      pAVar6 = *ppAVar1;
      *(AActor **)&((DThinker *)&actor->inext)->super_DObject = pAVar6;
      *(AActor ***)&((DThinker *)&actor->iprev)->super_DObject = ppAVar1;
      *ppAVar1 = actor;
      if (pAVar6 != (AActor *)0x0) {
        pAVar6->iprev = (AActor **)&actor->inext;
      }
    }
    sVar3 = mthing->angle;
    *(double *)&((DThinker *)&(actor->Angles).Yaw)->super_DObject = (double)(int)sVar3;
    *(double *)&((DThinker *)&(actor->PrevAngles).Yaw)->super_DObject = (double)(int)sVar3;
    if ((0 < mthing->Conversation) && (iVar21 = GetConversation(mthing->Conversation), iVar21 != -1)
       ) {
      *(int *)&((DThinker *)&actor->ConversationRoot)->super_DObject = iVar21;
      *(FStrifeDialogueNode **)&((DThinker *)&actor->Conversation)->super_DObject =
           StrifeDialogues.Array[iVar21];
    }
    if (0.0 <= mthing->Alpha) {
      *(double *)&((DThinker *)&actor->Alpha)->super_DObject = mthing->Alpha;
    }
    uVar10 = mthing->RenderStyle;
    if (uVar10 != 0xe) {
      uVar17 = 0;
      if (uVar10 < 0xe) {
        uVar17 = (ulong)uVar10;
      }
      *(FRenderStyle *)&((DThinker *)&actor->RenderStyle)->super_DObject =
           LegacyRenderStyles[uVar17];
    }
    dVar23 = (mthing->Scale).X;
    if ((dVar23 != 0.0) || (NAN(dVar23))) {
      *(double *)&((DThinker *)&actor->Scale)->super_DObject =
           dVar23 * *(double *)&((DThinker *)&actor->Scale)->super_DObject;
    }
    dVar23 = (mthing->Scale).Y;
    if ((dVar23 != 0.0) || (NAN(dVar23))) {
      *(double *)&((DThinker *)&(actor->Scale).Y)->super_DObject =
           dVar23 * *(double *)&((DThinker *)&(actor->Scale).Y)->super_DObject;
    }
    if (mthing->pitch != 0) {
      *(double *)&((DThinker *)&actor->Angles)->super_DObject = (double)(int)mthing->pitch;
    }
    if (mthing->roll != 0) {
      *(double *)&((DThinker *)&(actor->Angles).Roll)->super_DObject = (double)(int)mthing->roll;
    }
    if (mthing->score != 0) {
      *(int *)&((DThinker *)&actor->Score)->super_DObject = mthing->score;
    }
    if (mthing->fillcolor != 0) {
      *(DWORD *)&((DThinker *)&actor->fillcolor)->super_DObject = mthing->fillcolor;
    }
    (*(actor->super_DThinker).super_DObject._vptr_DObject[9])(actor);
    if (((ulong)*(_func_int ***)&(actor->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      (*(actor->super_DThinker).super_DObject._vptr_DObject[10])(actor);
    }
    iVar21 = mthing->health;
    if (iVar21 < 1) {
      iVar16 = -iVar21;
    }
    else {
      iVar16 = *(int *)&((DThinker *)&actor->health)->super_DObject * iVar21;
    }
    *(int *)&((DThinker *)&actor->health)->super_DObject = iVar16;
    if (iVar21 != 1) {
      if (iVar21 != 0) {
        *(int *)&((DThinker *)&actor->StartHealth)->super_DObject =
             *(int *)&((DThinker *)&actor->health)->super_DObject;
        return actor;
      }
      (*(actor->super_DThinker).super_DObject._vptr_DObject[0xf])(actor,0,0,0);
      return actor;
    }
    return actor;
  }
  if (mthing->args[0] != position) {
    return (AActor *)0x0;
  }
  local_50.pos.X = (mthing->pos).X;
  local_50.pos.Y = (mthing->pos).Y;
  local_50.pos.Z = (mthing->pos).Z;
  local_50.angle = mthing->angle;
  local_50.type = (short)(iVar21 + 1);
  playerstarts[iVar21].pos.Z = local_50.pos.Z;
  playerstarts[iVar21].pos.Y = local_50.pos.Y;
  playerstarts[iVar21].pos.X = local_50.pos.X;
  playerstarts[iVar21].angle = local_50.angle;
  playerstarts[iVar21].type = local_50.type;
  if ((level.flags2 & 1) == 0) {
    if (AllPlayerStarts.Count == 0) {
      uVar10 = 0;
    }
    else {
      psVar19 = &(AllPlayerStarts.Array)->type;
      uVar11 = 0;
      do {
        if (iVar21 + 1 == (int)*psVar19) {
          *(double *)(psVar19 + -5) = local_50.pos.Z;
          *(double *)(psVar19 + -9) = local_50.pos.Y;
          (((FPlayerStart *)(psVar19 + -0xd))->pos).X = local_50.pos.X;
          *(undefined4 *)(psVar19 + -1) = local_50._24_4_;
          uVar10 = uVar11;
          break;
        }
        uVar11 = uVar11 + 1;
        psVar19 = psVar19 + 0x10;
        uVar10 = AllPlayerStarts.Count;
      } while (AllPlayerStarts.Count != uVar11);
    }
    if (uVar10 != AllPlayerStarts.Count) goto LAB_00527b45;
  }
  TArray<FPlayerStart,_FPlayerStart>::Push(&AllPlayerStarts,&local_50);
LAB_00527b45:
  if ((deathmatch.Value == 0) && ((level.flags2 & 1) == 0)) {
    pAVar14 = P_SpawnPlayer(&local_50,iVar21,level.flags2 >> 6 & 2);
    return &pAVar14->super_AActor;
  }
  return (AActor *)0x0;
}

Assistant:

AActor *P_SpawnMapThing (FMapThing *mthing, int position)
{
	PClassActor *i;
	int mask;
	AActor *mobj;

	if (mthing->EdNum == 0 || mthing->EdNum == -1)
		return NULL;

	// find which type to spawn
	FDoomEdEntry *mentry = mthing->info;

	if (mentry == NULL)
	{
		// [RH] Don't die if the map tries to spawn an unknown thing
		Printf("Unknown type %i at (%.1f, %.1f)\n",
			mthing->EdNum, mthing->pos.X, mthing->pos.Y);
		mentry = DoomEdMap.CheckKey(0);
		if (mentry == NULL)	// we need a valid entry for the rest of this function so if we can't find a default, let's exit right away.
		{
		return NULL;
	}
	}
	if (mentry->Type == NULL && mentry->Special <= 0)
	{
		// has been explicitly set to not spawning anything.
		return NULL;
	}

	// copy args to mapthing so that we have them in one place for the rest of this function	
	if (mentry->ArgsDefined > 0)
	{
		if (mentry->Type!= NULL) mthing->special = mentry->Special;
		memcpy(mthing->args, mentry->Args, sizeof(mthing->args[0]) * mentry->ArgsDefined);
	}

	int pnum = -1;
	if (mentry->Type == NULL)
	{

		switch (mentry->Special)
		{
		case SMT_DeathmatchStart:
		{
			// count deathmatch start positions
			FPlayerStart start(mthing, 0);
			deathmatchstarts.Push(start);
			return NULL;
		}

		case SMT_PolyAnchor:
		case SMT_PolySpawn:
		case SMT_PolySpawnCrush:
		case SMT_PolySpawnHurt:
	{
		polyspawns_t *polyspawn = new polyspawns_t;
		polyspawn->next = polyspawns;
		polyspawn->pos = mthing->pos;
		polyspawn->angle = mthing->angle;
		polyspawn->type = mentry->Special;
		polyspawns = polyspawn;
			if (mentry->Special != SMT_PolyAnchor)
			po_NumPolyobjs++;
		return NULL;
	}

		case SMT_Player1Start:
		case SMT_Player2Start:
		case SMT_Player3Start:
		case SMT_Player4Start:
		case SMT_Player5Start:
		case SMT_Player6Start:
		case SMT_Player7Start:
		case SMT_Player8Start:
			pnum = mentry->Special - SMT_Player1Start;
			break;

		// Sound sequence override will be handled later
		default:
			break;

	}
		}

	if (pnum == -1 || (level.flags & LEVEL_FILTERSTARTS))
	{
		// check for appropriate game type
		if (deathmatch) 
		{
			mask = MTF_DEATHMATCH;
		}
		else if (multiplayer)
		{
			mask = MTF_COOPERATIVE;
		}
		else
		{
			mask = MTF_SINGLE;
		}
		if (!(mthing->flags & mask))
		{
			return NULL;
		}

		mask = G_SkillProperty(SKILLP_SpawnFilter);
		if (!(mthing->SkillFilter & mask))
		{
			return NULL;
		}

		// Check class spawn masks. Now with player classes available
		// this is enabled for all games.
		if (!multiplayer)
		{ // Single player
			int spawnmask = players[consoleplayer].GetSpawnClass();
			if (spawnmask != 0 && (mthing->ClassFilter & spawnmask) == 0)
			{ // Not for current class
				return NULL;
			}
		}
		else if (!deathmatch)
		{ // Cooperative
			mask = 0;
			for (int i = 0; i < MAXPLAYERS; i++)
			{
				if (playeringame[i])
				{
					int spawnmask = players[i].GetSpawnClass();
					if (spawnmask != 0)
						mask |= spawnmask;
					else 
						mask = -1;
				}
			}
			if (mask != -1 && (mthing->ClassFilter & mask) == 0)
			{
				return NULL;
			}
		}
	}

	if (pnum != -1)
	{
		// [RH] Only spawn spots that match position.
		if (mthing->args[0] != position)
			return NULL;

		// save spots for respawning in network games
		FPlayerStart start(mthing, pnum+1);
		playerstarts[pnum] = start;
		if (level.flags2 & LEVEL2_RANDOMPLAYERSTARTS)
		{ // When using random player starts, all starts count
			AllPlayerStarts.Push(start);
		}
		else
		{ // When not using random player starts, later single player
		  // starts should override earlier ones, since the earlier
		  // ones are for voodoo dolls and not likely to be ideal for
		  // spawning regular players.
			unsigned i;
			for (i = 0; i < AllPlayerStarts.Size(); ++i)
			{
				if (AllPlayerStarts[i].type == pnum+1)
				{
					AllPlayerStarts[i] = start;
					break;
				}
			}
			if (i == AllPlayerStarts.Size())
			{
				AllPlayerStarts.Push(start);
			}
		}
		if (!deathmatch && !(level.flags2 & LEVEL2_RANDOMPLAYERSTARTS))
		{
			return P_SpawnPlayer(&start, pnum, (level.flags2 & LEVEL2_PRERAISEWEAPON) ? SPF_WEAPONFULLYUP : 0);
		}
		return NULL;
	}

	// [RH] sound sequence overriders
	if (mentry->Type == NULL && mentry->Special == SMT_SSeqOverride)
	{
		int type = mthing->args[0];
		if (type == 255) type = -1;
		if (type > 63)
		{
			Printf ("Sound sequence %d out of range\n", type);
		}
		else
		{
			P_PointInSector (mthing->pos)->seqType = type;
		}
		return NULL;
	}

	// [RH] If the thing's corresponding sprite has no frames, also map
	//		it to the unknown thing.
		// Handle decorate replacements explicitly here
		// to check for missing frames in the replacement object.
	i = mentry->Type->GetReplacement();

		const AActor *defaults = GetDefaultByType (i);
		if (defaults->SpawnState == NULL ||
			sprites[defaults->SpawnState->sprite].numframes == 0)
		{
			// We don't load mods for shareware games so we'll just ignore
			// missing actors. Heretic needs this since the shareware includes
			// the retail weapons in Deathmatch.
			if (gameinfo.flags & GI_SHAREWARE)
				return NULL;

			Printf ("%s at (%.1f, %.1f) has no frames\n",
					i->TypeName.GetChars(), mthing->pos.X, mthing->pos.Y);
			i = PClass::FindActor("Unknown");
			assert(i->IsKindOf(RUNTIME_CLASS(PClassActor)));
		}

	const AActor *info = GetDefaultByType (i);

	// don't spawn keycards and players in deathmatch
	if (deathmatch && info->flags & MF_NOTDMATCH)
		return NULL;

	// [RH] don't spawn extra weapons in coop if so desired
	if (multiplayer && !deathmatch && (dmflags & DF_NO_COOP_WEAPON_SPAWN))
	{
		if (GetDefaultByType(i)->flags7 & MF7_WEAPONSPAWN)
		{
			if ((mthing->flags & (MTF_DEATHMATCH|MTF_SINGLE)) == MTF_DEATHMATCH)
				return NULL;
		}
	}

	// don't spawn any monsters if -nomonsters
	if (((level.flags2 & LEVEL2_NOMONSTERS) || (dmflags & DF_NO_MONSTERS)) && info->flags3 & MF3_ISMONSTER )
	{
		return NULL;
	}
	
	// [RH] Other things that shouldn't be spawned depending on dmflags
	if (deathmatch || alwaysapplydmflags)
	{
		if (dmflags & DF_NO_HEALTH)
		{
			if (i->IsDescendantOf (RUNTIME_CLASS(AHealth)))
				return NULL;
			if (i->TypeName == NAME_Berserk)
				return NULL;
			if (i->TypeName == NAME_Megasphere)
				return NULL;
		}
		if (dmflags & DF_NO_ITEMS)
		{
//			if (i->IsDescendantOf (RUNTIME_CLASS(AArtifact)))
//				return;
		}
		if (dmflags & DF_NO_ARMOR)
		{
			if (i->IsDescendantOf (RUNTIME_CLASS(AArmor)))
				return NULL;
			if (i->TypeName == NAME_Megasphere)
				return NULL;
		}
	}

	// spawn it
	double sz;

	if (info->flags & MF_SPAWNCEILING)
		sz = ONCEILINGZ;
	else if (info->flags2 & MF2_SPAWNFLOAT)
		sz = FLOATRANDZ;
	else
		sz = ONFLOORZ;

	mobj = AActor::StaticSpawn (i, DVector3(mthing->pos, sz), NO_REPLACE, true);

	if (sz == ONFLOORZ)
	{
		mobj->AddZ(mthing->pos.Z);
		if ((mobj->flags2 & MF2_FLOATBOB) && (ib_compatflags & BCOMPATF_FLOATBOB))
		{
			mobj->specialf1 = mthing->pos.Z;
		}
	}
	else if (sz == ONCEILINGZ)
		mobj->AddZ(-mthing->pos.Z);

	mobj->SpawnPoint = mthing->pos;
	mobj->SpawnAngle = mthing->angle;
	mobj->SpawnFlags = mthing->flags;
	if (mthing->FloatbobPhase >= 0 && mthing->FloatbobPhase < 64) mobj->FloatBobPhase = mthing->FloatbobPhase;
	if (mthing->Gravity < 0) mobj->Gravity = -mthing->Gravity;
	else if (mthing->Gravity > 0) mobj->Gravity *= mthing->Gravity;
	else mobj->flags &= ~MF_NOGRAVITY;

	// For Hexen floatbob 'compatibility' we do not really want to alter the floorz.
	if (mobj->specialf1 == 0 || !(mobj->flags2 & MF2_FLOATBOB) || !(ib_compatflags & BCOMPATF_FLOATBOB))
	{
		P_FindFloorCeiling(mobj, FFCF_SAMESECTOR | FFCF_ONLY3DFLOORS | FFCF_3DRESTRICT);
	}

	// if the actor got args defined either in DECORATE or MAPINFO we must ignore the map's properties.
	if (!(mobj->flags2 & MF2_ARGSDEFINED))
	{
		// [RH] Set the thing's special
		mobj->special = mthing->special;
		for(int j=0;j<5;j++) mobj->args[j]=mthing->args[j];
	}

	// [RH] Add ThingID to mobj and link it in with the others
	mobj->tid = mthing->thingid;
	mobj->AddToHash ();

	mobj->PrevAngles.Yaw = mobj->Angles.Yaw = (double)mthing->angle;

	// Check if this actor's mapthing has a conversation defined
	if (mthing->Conversation > 0)
	{
		// Make sure that this does not partially overwrite the default dialogue settings.
		int root = GetConversation(mthing->Conversation);
		if (root != -1)
		{
			mobj->ConversationRoot = root;
			mobj->Conversation = StrifeDialogues[mobj->ConversationRoot];
		}
	}

	// Set various UDMF options
	if (mthing->Alpha >= 0)
		mobj->Alpha = mthing->Alpha;
	if (mthing->RenderStyle != STYLE_Count)
		mobj->RenderStyle = (ERenderStyle)mthing->RenderStyle;
	if (mthing->Scale.X != 0)
		mobj->Scale.X = mthing->Scale.X * mobj->Scale.X;
	if (mthing->Scale.Y != 0)
		mobj->Scale.Y = mthing->Scale.Y * mobj->Scale.Y;
	if (mthing->pitch)
		mobj->Angles.Pitch = (double)mthing->pitch;
	if (mthing->roll)
		mobj->Angles.Roll = (double)mthing->roll;
	if (mthing->score)
		mobj->Score = mthing->score;
	if (mthing->fillcolor)
		mobj->fillcolor = mthing->fillcolor;

	mobj->BeginPlay ();
	if (!(mobj->ObjectFlags & OF_EuthanizeMe))
	{
		mobj->LevelSpawned ();
	}

	if (mthing->health > 0)
		mobj->health *= mthing->health;
	else
		mobj->health = -mthing->health;
	if (mthing->health == 0)
		mobj->Die(NULL, NULL);
	else if (mthing->health != 1)
		mobj->StartHealth = mobj->health;

	return mobj;
}